

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O2

string * __thiscall
leveldb::InternalKey::DebugString_abi_cxx11_(string *__return_storage_ptr__,InternalKey *this)

{
  ulong uVar1;
  Slice *value;
  string local_60;
  ParsedInternalKey local_40;
  pointer local_20;
  size_type local_18;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar1 = (this->rep_)._M_string_length;
  if (7 < uVar1) {
    local_40.user_key.data_ = (this->rep_)._M_dataplus._M_p;
    local_40.type = (ValueType)*(ulong *)(local_40.user_key.data_ + (uVar1 - 8)) & 0xff;
    local_40.sequence = *(ulong *)(local_40.user_key.data_ + (uVar1 - 8)) >> 8;
    local_40.user_key.size_ = uVar1 - 8;
    if (local_40.type < 2) {
      ParsedInternalKey::DebugString_abi_cxx11_(&local_60,&local_40);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_60);
      goto LAB_0010d3ec;
    }
  }
  std::__cxx11::string::assign((char *)__return_storage_ptr__);
  local_20 = (this->rep_)._M_dataplus._M_p;
  local_18 = (this->rep_)._M_string_length;
  EscapeString_abi_cxx11_(&local_60,(leveldb *)&local_20,value);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
LAB_0010d3ec:
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string InternalKey::DebugString() const {
        std::string result;
        ParsedInternalKey parsed;
        if (ParseInternalKey(rep_, &parsed)) {
            result = parsed.DebugString();
        } else {
            result = "(bad)";
            result.append(EscapeString(rep_));
        }
        return result;
    }